

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O2

RC __thiscall
QO_Manager::ApplyGTCond
          (QO_Manager *this,
          map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
          *attr_stats,int condIdx,float *numTuples)

{
  undefined1 auVar1 [16];
  int iVar2;
  RC RVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  QO_Manager *pQVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  int idx;
  int idx2;
  float value;
  float local_98;
  float fStack_94;
  int local_80;
  int local_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [20];
  float local_34;
  
  RVar3 = CondToAttrIdx(this,condIdx,&local_80,&local_7c);
  iVar2 = local_80;
  if (RVar3 == 0) {
    pQVar6 = (QO_Manager *)attr_stats;
    if (this->conds[condIdx].bRhsIsAttr == 0) {
      ConvertValueToFloat(this,condIdx,&local_34);
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      local_68 = ZEXT416((uint)local_34);
      fVar7 = pmVar4->maxValue;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      fVar8 = pmVar4->maxValue;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      fVar8 = ((fVar7 - (float)local_68._0_4_) + 1.0) / ((fVar8 - pmVar4->minValue) + 2.0);
      *numTuples = *numTuples * fVar8;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      fVar7 = pmVar4->numTuples;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      pmVar4->numTuples = fVar8 * fVar7;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      fVar7 = (float)local_68._0_4_;
    }
    else {
      local_80 = local_7c;
      local_7c = iVar2;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      fVar7 = pmVar5->maxValue;
      if (pmVar4->maxValue <= pmVar5->maxValue) {
        fVar7 = pmVar4->maxValue;
      }
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      fVar8 = pmVar5->minValue;
      if (pmVar5->minValue <= pmVar4->minValue) {
        fVar8 = pmVar4->minValue;
      }
      fVar7 = (fVar8 + fVar7) * 0.5;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      local_68 = ZEXT416((uint)pmVar4->maxValue);
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      _local_78 = ZEXT416((uint)pmVar4->maxValue);
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      local_58 = ZEXT416((uint)pmVar4->minValue);
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      local_48._0_16_ = ZEXT416((uint)pmVar4->minValue);
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      fStack_6c = (float)local_78._4_4_;
      local_78._4_4_ = local_78._0_4_;
      local_78._0_4_ = pmVar4->maxValue;
      fStack_70 = 0.0;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      auVar10._4_4_ = ((float)local_68._0_4_ - fVar7) + 1.0;
      auVar10._0_4_ = (fVar7 - (float)local_48._0_4_) + 1.0;
      auVar10._8_4_ = (0.0 - (float)local_48._4_4_) + 0.0;
      auVar10._12_4_ = ((float)local_68._4_4_ - 0.0) + 0.0;
      auVar10 = maxps(ZEXT816(0),auVar10);
      auVar1._4_4_ = ((float)local_78._4_4_ - (float)local_58._0_4_) + 1.0;
      auVar1._0_4_ = ((float)local_78._0_4_ - pmVar4->minValue) + 1.0;
      auVar1._8_4_ = (fStack_70 - 0.0) + 0.0;
      auVar1._12_4_ = (fStack_6c - (float)local_58._4_4_) + 0.0;
      auVar10 = divps(auVar10,auVar1);
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      fVar7 = pmVar5->maxValue;
      if (pmVar4->maxValue <= pmVar5->maxValue) {
        fVar7 = pmVar4->maxValue;
      }
      local_68 = ZEXT416((uint)fVar7);
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      pmVar5 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      fVar7 = pmVar5->minValue;
      if (pmVar4->minValue <= pmVar5->minValue) {
        fVar7 = pmVar4->minValue;
      }
      local_58._0_4_ = fVar7;
      local_98 = auVar10._0_4_;
      fStack_94 = auVar10._4_4_;
      if (fStack_94 <= local_98) {
        fStack_94 = local_98;
      }
      *numTuples = fStack_94 * *numTuples;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      fVar7 = pmVar4->numTuples;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      _local_78 = ZEXT416((uint)pmVar4->minValue);
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      local_48._0_16_ = ZEXT416((uint)pmVar4->maxValue);
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      fVar8 = (float)local_68._0_4_ - (float)local_78._0_4_;
      fVar9 = (float)local_48._0_4_ - pmVar4->minValue;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      pmVar4->numTuples = (fVar7 * (fVar8 + 1.0)) / (fVar9 + 2.0);
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      fVar7 = pmVar4->numTuples;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      fVar8 = pmVar4->maxValue - (float)local_58._0_4_;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      local_78._0_4_ = pmVar4->maxValue;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      fVar9 = (float)local_78._0_4_ - pmVar4->minValue;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_7c);
      pmVar4->numTuples = (fVar8 * fVar7) / (fVar9 + 2.0);
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      pmVar4->maxValue = (float)local_68._0_4_;
      pmVar4 = std::
               map<int,_attrStat,_std::less<int>,_std::allocator<std::pair<const_int,_attrStat>_>_>
               ::operator[](attr_stats,&local_80);
      fVar7 = (float)local_58._0_4_;
    }
    pmVar4->minValue = fVar7;
    NormalizeStats(pQVar6,attr_stats,fVar7,*numTuples,local_80,local_7c);
  }
  return RVar3;
}

Assistant:

RC QO_Manager::ApplyGTCond(map<int, attrStat> &attr_stats, int condIdx, float& numTuples){
  RC rc = 0;
  // Retrieves the indices of the condition attributes
  int idx, idx2;
  if((rc = CondToAttrIdx(condIdx, idx, idx2)))
    return (rc);
  float frac = 0.0;
  if(conds[condIdx].bRhsIsAttr){
    swap(idx, idx2); // the following is the same as LT, except attr indices are swapped
    float mid = 0.5*(min(attr_stats[idx].maxValue, attr_stats[idx2].maxValue) + 
      max(attr_stats[idx].minValue, attr_stats[idx2].minValue));
    float fracS = max(attr_stats[idx2].maxValue - mid + 1, (float)0.0) / 
      (attr_stats[idx2].maxValue - attr_stats[idx2].minValue + 1);
    float fracR = max(mid - attr_stats[idx].minValue + 1, (float)0.0) / 
      (attr_stats[idx].maxValue - attr_stats[idx].minValue + 1);
    float newMaxR = min(attr_stats[idx].maxValue, attr_stats[idx2].maxValue);
    float newMinS = min(attr_stats[idx].minValue, attr_stats[idx2].minValue);
    numTuples = numTuples * max(fracR, fracS);
    attr_stats[idx].numTuples = attr_stats[idx].numTuples*(newMaxR - attr_stats[idx].minValue + 1)/
      (attr_stats[idx].maxValue - attr_stats[idx].minValue + 2);
    attr_stats[idx2].numTuples = attr_stats[idx].numTuples*(attr_stats[idx2].maxValue - newMinS)/
      (attr_stats[idx2].maxValue - attr_stats[idx2].minValue + 2);
    attr_stats[idx].maxValue = newMaxR;
    attr_stats[idx].minValue = newMinS;
    frac = max(fracR, fracS);
  }
  else{
    float value;
    ConvertValueToFloat(condIdx, value); // get the min value
    // calculate the fraction of values expected to survive the condition. assume
    // that values for relation are evenly distributed
    float fracR = (attr_stats[idx].maxValue - value + 1)/(attr_stats[idx].maxValue - attr_stats[idx].minValue + 2);
    // update values
    numTuples = numTuples*fracR; 
    attr_stats[idx].numTuples = attr_stats[idx].numTuples * fracR;
    attr_stats[idx].minValue = value;
    frac = fracR;
  }
  // Normalize non-join attributes
  NormalizeStats(attr_stats, frac, numTuples, idx, idx2);
  return (0);
}